

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void helics::generateFederateException(FederateState *fed)

{
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  int iVar1;
  size_t sVar2;
  undefined8 uVar3;
  string *psVar4;
  FederateState *in_RDI;
  int eCode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  HelicsException *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  
  iVar1 = FederateState::lastErrorCode(in_RDI);
  switch(iVar1) {
  case 0:
    return;
  case -10:
    uVar3 = __cxa_allocate_exception(0x28);
    FederateState::lastErrorString_abi_cxx11_(in_RDI);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff00);
    message_00._M_str = in_stack_ffffffffffffff20;
    message_00._M_len = in_stack_ffffffffffffff18;
    InvalidFunctionCall::InvalidFunctionCall
              ((InvalidFunctionCall *)in_stack_ffffffffffffff10,message_00);
    __cxa_throw(uVar3,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  case -9:
    uVar3 = __cxa_allocate_exception(0x28);
    FederateState::lastErrorString_abi_cxx11_(in_RDI);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff00);
    message_02._M_str = in_stack_ffffffffffffff20;
    message_02._M_len = in_stack_ffffffffffffff18;
    InvalidFunctionCall::InvalidFunctionCall
              ((InvalidFunctionCall *)in_stack_ffffffffffffff10,message_02);
    __cxa_throw(uVar3,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  default:
    uVar3 = __cxa_allocate_exception(0x28);
    psVar4 = FederateState::lastErrorString_abi_cxx11_(in_RDI);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar4);
    message_05._M_str = in_stack_ffffffffffffff20;
    message_05._M_len = in_stack_ffffffffffffff18;
    HelicsException::HelicsException(in_stack_ffffffffffffff10,message_05);
    __cxa_throw(uVar3,&HelicsException::typeinfo,HelicsException::~HelicsException);
  case -4:
    uVar3 = __cxa_allocate_exception(0x28);
    FederateState::lastErrorString_abi_cxx11_(in_RDI);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff00);
    message._M_str = in_stack_ffffffffffffff20;
    message._M_len = in_stack_ffffffffffffff18;
    InvalidParameter::InvalidParameter((InvalidParameter *)in_stack_ffffffffffffff10,message);
    __cxa_throw(uVar3,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
  case -3:
    uVar3 = __cxa_allocate_exception(0x28);
    FederateState::lastErrorString_abi_cxx11_(in_RDI);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff00);
    message_01._M_str = in_stack_ffffffffffffff20;
    message_01._M_len = in_stack_ffffffffffffff18;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_ffffffffffffff10,message_01);
    __cxa_throw(uVar3,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  case -2:
    sVar2 = __cxa_allocate_exception(0x28);
    psVar4 = FederateState::lastErrorString_abi_cxx11_(in_RDI);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff00);
    message_03._M_str = (char *)psVar4;
    message_03._M_len = sVar2;
    ConnectionFailure::ConnectionFailure((ConnectionFailure *)in_stack_ffffffffffffff10,message_03);
    __cxa_throw(sVar2,&ConnectionFailure::typeinfo,ConnectionFailure::~ConnectionFailure);
  case -1:
    uVar3 = __cxa_allocate_exception(0x28);
    psVar4 = FederateState::lastErrorString_abi_cxx11_(in_RDI);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff00);
    message_04._M_str = in_stack_ffffffffffffff20;
    message_04._M_len = in_stack_ffffffffffffff18;
    RegistrationFailure::RegistrationFailure((RegistrationFailure *)psVar4,message_04);
    __cxa_throw(uVar3,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
  }
}

Assistant:

static void generateFederateException(const FederateState* fed)
{
    auto eCode = fed->lastErrorCode();
    switch (eCode) {
        case 0:
            return;
        case defs::Errors::INVALID_ARGUMENT:
            throw(InvalidParameter(fed->lastErrorString()));
        case defs::Errors::INVALID_FUNCTION_CALL:
            throw(InvalidFunctionCall(fed->lastErrorString()));
        case defs::Errors::INVALID_OBJECT:
            throw(InvalidIdentifier(fed->lastErrorString()));
        case defs::Errors::INVALID_STATE_TRANSITION:
            throw(InvalidFunctionCall(fed->lastErrorString()));
        case defs::Errors::CONNECTION_FAILURE:
            throw(ConnectionFailure(fed->lastErrorString()));
        case defs::Errors::REGISTRATION_FAILURE:
            throw(RegistrationFailure(fed->lastErrorString()));
        default:
            throw(HelicsException(fed->lastErrorString()));
    }
}